

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O0

PortConnection * __thiscall
slang::ast::anon_unknown_0::PortConnectionBuilder::getImplicitInterface
          (PortConnectionBuilder *this,InterfacePortSymbol *port,SourceRange range,
          span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> attributes,
          bool isWildcard)

{
  LookupLocation lookupLocation;
  string_view arg;
  string_view arg_00;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> attributes_00;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> trivia;
  string_view rawText;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  type *ptVar1;
  undefined8 in_RDX;
  long in_RSI;
  Scope *in_RDI;
  InterfacePortSymbol *in_R8;
  PortConnectionBuilder *in_R9;
  byte in_stack_00000008;
  type *connExpr;
  type *conn;
  ASTContext context;
  IdentifierNameSyntax *idName;
  Token id;
  Scope *in_stack_00000138;
  Diagnostic *diag;
  string_view in_stack_00000148;
  Symbol *symbol;
  ExpressionSyntax *in_stack_00000248;
  InterfacePortSymbol *in_stack_00000250;
  ASTContext *in_stack_00000258;
  PortConnectionBuilder *in_stack_00000260;
  InterfacePortSymbol *in_stack_fffffffffffffe38;
  PortConnectionBuilder *in_stack_fffffffffffffe40;
  Scope *scope;
  SourceLocation in_stack_fffffffffffffe48;
  ASTContext *this_00;
  BumpAllocator *in_stack_fffffffffffffe50;
  bitmask<slang::ast::ASTFlags> flags;
  Compilation *expr;
  TokenKind in_stack_fffffffffffffe7e;
  Diagnostic *in_stack_fffffffffffffe80;
  Token *in_stack_fffffffffffffe88;
  SourceLocation in_stack_fffffffffffffe90;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffe98;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffea0;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  Scope *in_stack_ffffffffffffff78;
  SourceLocation in_stack_ffffffffffffff80;
  SourceLocation in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  DiagCode code;
  bitmask<slang::ast::LookupFlags> local_5c;
  undefined8 local_58;
  undefined8 local_50;
  Symbol *local_48;
  byte local_39;
  long local_38;
  InterfacePortSymbol *local_28;
  PortConnectionBuilder *local_20;
  undefined1 local_18 [16];
  PortConnection *local_8;
  
  local_18._4_4_ = (undefined4)((ulong)in_RDX >> 0x20);
  code = SUB84((ulong)in_stack_ffffffffffffff90 >> 0x20,0);
  local_39 = in_stack_00000008 & 1;
  expr = in_RDI->compilation;
  local_58 = *(undefined8 *)(in_RSI + 8);
  local_50 = *(undefined8 *)(in_RSI + 0x10);
  local_38 = in_RSI;
  local_28 = in_R8;
  local_20 = in_R9;
  bitmask<slang::ast::LookupFlags>::bitmask(&local_5c,None);
  local_48 = Lookup::unqualified(in_stack_00000138,in_stack_00000148,diag._4_4_);
  if (local_48 == (Symbol *)0x0) {
    sourceRange.endLoc = in_stack_ffffffffffffff88;
    sourceRange.startLoc = in_stack_ffffffffffffff80;
    Scope::addDiag(in_stack_ffffffffffffff78,(DiagCode)local_18._4_4_,sourceRange);
    arg._M_str = (char *)in_stack_fffffffffffffe90;
    arg._M_len = (size_t)in_stack_fffffffffffffe88;
    Diagnostic::operator<<(in_stack_fffffffffffffe80,arg);
    local_8 = emptyConnection(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  }
  else {
    if (((local_39 & 1) != 0) && ((*(byte *)(local_38 + 0x58) & 1) != 0)) {
      sourceRange_00.endLoc = in_stack_ffffffffffffff88;
      sourceRange_00.startLoc = in_stack_ffffffffffffff80;
      Scope::addDiag(in_stack_ffffffffffffff78,code,sourceRange_00);
      arg_00._M_str = (char *)in_stack_fffffffffffffe90;
      arg_00._M_len = (size_t)in_stack_fffffffffffffe88;
      Diagnostic::operator<<(in_stack_fffffffffffffe80,arg_00);
      Diagnostic::addNote((Diagnostic *)in_stack_fffffffffffffe40,
                          SUB84((ulong)in_stack_fffffffffffffe50 >> 0x20,0),
                          in_stack_fffffffffffffe48);
    }
    this_00 = (ASTContext *)in_RDI->nameMap;
    std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::span
              ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)0x51c044);
    scope = *(Scope **)(local_38 + 0x10);
    SourceRange::start((SourceRange *)local_18);
    trivia._M_extent._M_extent_value = in_stack_fffffffffffffea0._M_extent_value;
    trivia._M_ptr = (pointer)in_stack_fffffffffffffe98._M_extent_value;
    rawText._M_str = in_stack_fffffffffffffeb8;
    rawText._M_len = in_stack_fffffffffffffeb0.m_bits;
    parsing::Token::Token
              (in_stack_fffffffffffffe88,(BumpAllocator *)in_stack_fffffffffffffe80,
               in_stack_fffffffffffffe7e,trivia,rawText,in_stack_fffffffffffffe90);
    BumpAllocator::emplace<slang::syntax::IdentifierNameSyntax,slang::parsing::Token&>
              (in_stack_fffffffffffffe50,(Token *)this_00);
    flags.m_bits = (underlying_type)in_RDI->compilation;
    bitmask<slang::ast::ASTFlags>::bitmask
              ((bitmask<slang::ast::ASTFlags> *)&stack0xfffffffffffffeb0,NonProcedural);
    lookupLocation._8_8_ = expr;
    lookupLocation.scope = in_RDI;
    ASTContext::ASTContext(this_00,scope,lookupLocation,flags);
    getInterfaceConn(in_stack_00000260,in_stack_00000258,in_stack_00000250,in_stack_00000248);
    ptVar1 = std::
             get<0ul,std::pair<slang::ast::Symbol_const*,slang::ast::ModportSymbol_const*>,slang::ast::Expression_const*>
                       ((pair<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::ModportSymbol_*>,_const_slang::ast::Expression_*>
                         *)0x51c16c);
    std::
    get<1ul,std::pair<slang::ast::Symbol_const*,slang::ast::ModportSymbol_const*>,slang::ast::Expression_const*>
              ((pair<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::ModportSymbol_*>,_const_slang::ast::Expression_*>
                *)0x51c17b);
    attributes_00._M_extent._M_extent_value = in_stack_fffffffffffffe98._M_extent_value;
    attributes_00._M_ptr = (pointer)ptVar1;
    local_8 = createConnection(local_20,local_28,*ptVar1,(Expression *)expr,attributes_00);
  }
  return local_8;
}

Assistant:

PortConnection* getImplicitInterface(const InterfacePortSymbol& port, SourceRange range,
                                         std::span<const AttributeSymbol* const> attributes,
                                         bool isWildcard) {
        auto symbol = Lookup::unqualified(scope, port.name);
        if (!symbol) {
            scope.addDiag(diag::ImplicitNamedPortNotFound, range) << port.name;
            return emptyConnection(port);
        }

        if (isWildcard && port.isGeneric) {
            auto& diag = scope.addDiag(diag::WildcardPortGenericIface, range) << port.name;
            diag.addNote(diag::NoteDeclarationHere, port.location);
        }

        // This is a bit inefficient but it simplifies the implementation to just
        // wrap the name up in a fake expression and defer to the normal expression
        // handling connection path.
        Token id(comp, TokenKind::Identifier, {}, port.name, range.start());
        auto idName = comp.emplace<IdentifierNameSyntax>(id);

        ASTContext context(scope, lookupLocation, ASTFlags::NonProcedural);
        auto [conn, connExpr] = getInterfaceConn(context, port, *idName);
        return createConnection(port, conn, connExpr, attributes);
    }